

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSat.c
# Opt level: O3

Abc_Cex_t * Saig_RefManReason2Cex(Saig_RefMan_t *p,Vec_Int_t *vReasons)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  int *piVar4;
  Abc_Cex_t *pAVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  
  pAVar5 = Abc_CexDup(p->pCex,p->pCex->nRegs);
  memset(pAVar5 + 1,0,
         (long)(int)(((pAVar5->nBits >> 5) + 1) - (uint)((pAVar5->nBits & 0x1fU) == 0)) << 2);
  if (0 < vReasons->nSize) {
    piVar3 = vReasons->pArray;
    lVar7 = 0;
    do {
      uVar1 = piVar3[lVar7];
      if (((int)uVar1 < 0) || (p->pFrames->nObjs[2] <= (int)uVar1)) {
        __assert_fail("Entry >= 0 && Entry < Aig_ManCiNum(p->pFrames)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absOldSat.c"
                      ,0x65,"Abc_Cex_t *Saig_RefManReason2Cex(Saig_RefMan_t *, Vec_Int_t *)");
      }
      uVar2 = p->vMapPiF2A->nSize;
      if (((int)uVar2 <= (int)(uVar1 * 2)) || (uVar8 = uVar1 * 2 | 1, uVar2 <= uVar8)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar4 = p->vMapPiF2A->pArray;
      iVar6 = pAVar5->nRegs + piVar4[(ulong)uVar1 * 2] + pAVar5->nPis * piVar4[uVar8];
      (&pAVar5[1].iPo)[iVar6 >> 5] = (&pAVar5[1].iPo)[iVar6 >> 5] | 1 << ((byte)iVar6 & 0x1f);
      lVar7 = lVar7 + 1;
    } while (lVar7 < vReasons->nSize);
  }
  return pAVar5;
}

Assistant:

Abc_Cex_t * Saig_RefManReason2Cex( Saig_RefMan_t * p, Vec_Int_t * vReasons )
{
    Abc_Cex_t * pCare;
    int i, Entry, iInput, iFrame;
    pCare = Abc_CexDup( p->pCex, p->pCex->nRegs );
    memset( pCare->pData, 0, sizeof(unsigned) * Abc_BitWordNum(pCare->nBits) );
    Vec_IntForEachEntry( vReasons, Entry, i )
    {
        assert( Entry >= 0 && Entry < Aig_ManCiNum(p->pFrames) );
        iInput = Vec_IntEntry( p->vMapPiF2A, 2*Entry );
        iFrame = Vec_IntEntry( p->vMapPiF2A, 2*Entry+1 );
        Abc_InfoSetBit( pCare->pData, pCare->nRegs + pCare->nPis * iFrame + iInput );
    }
    return pCare;
}